

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseBreaks.cpp
# Opt level: O3

Expr * createListOfOneGoto(Block *container,Block *gotoTarget)

{
  GotoExpr *this;
  _Head_base<0UL,_Expr_*,_false> this_00;
  pointer *__ptr;
  vector<Expr_*,_std::allocator<Expr_*>_> exprs;
  __uniq_ptr_impl<Expr,_std::default_delete<Expr>_> local_48;
  _Head_base<0UL,_Expr_*,_false> local_40;
  vector<Expr_*,_std::allocator<Expr_*>_> local_38;
  _Head_base<0UL,_Expr_*,_false> local_20;
  
  this = (GotoExpr *)operator_new(0x20);
  GotoExpr::GotoExpr(this,gotoTarget);
  generatePhiAssignments(&local_38,container,(Block *)gotoTarget->block);
  local_20._M_head_impl = (Expr *)this;
  if (local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Expr*,std::allocator<Expr*>>::_M_realloc_insert<Expr*>
              ((vector<Expr*,std::allocator<Expr*>> *)&local_38,
               (iterator)
               local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_20._M_head_impl);
  }
  else {
    *local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
     _M_finish = (Expr *)this;
    local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  this_00._M_head_impl = (Expr *)operator_new(0x30);
  ExprList::ExprList((ExprList *)this_00._M_head_impl,&local_38);
  local_40._M_head_impl = (Expr *)this;
  Block::addOwnership(container,(unique_ptr<Expr,_std::default_delete<Expr>_> *)&local_40);
  if ((GotoExpr *)local_40._M_head_impl != (GotoExpr *)0x0) {
    (*(((ExprBase *)&(local_40._M_head_impl)->_vptr_Expr)->super_Expr)._vptr_Expr[1])();
  }
  local_40._M_head_impl = (Expr *)0x0;
  local_48._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
  super__Head_base<0UL,_Expr_*,_false>._M_head_impl =
       (tuple<Expr_*,_std::default_delete<Expr>_>)
       (tuple<Expr_*,_std::default_delete<Expr>_>)this_00._M_head_impl;
  Block::addOwnership(container,(unique_ptr<Expr,_std::default_delete<Expr>_> *)&local_48);
  if ((_Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>)
      local_48._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
      super__Head_base<0UL,_Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_48._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
                          super__Head_base<0UL,_Expr_*,_false>._M_head_impl + 8))();
  }
  local_48._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
  super__Head_base<0UL,_Expr_*,_false>._M_head_impl =
       (tuple<Expr_*,_std::default_delete<Expr>_>)
       (_Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>)0x0;
  if (local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (_Head_base<0UL,_Expr_*,_false>)this_00._M_head_impl;
}

Assistant:

static Expr* createListOfOneGoto(Block* container, Block* gotoTarget) {
    auto gotoExpr = std::make_unique<GotoExpr>(gotoTarget);

    std::vector<Expr*> exprs = generatePhiAssignments(container, gotoTarget);
    exprs.push_back(gotoExpr.get());
    auto list = std::make_unique<ExprList>(std::move(exprs));

    container->addOwnership(std::move(gotoExpr));
    auto* result = list.get();
    container->addOwnership(std::move(list));
    return result;
}